

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O1

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively<false>
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index johI,Index stage)

{
  DecPOMDPDiscreteInterface *pDVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  int iVar3;
  Index IVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double local_58;
  undefined1 extraout_var [56];
  
  iVar3 = (*(this->_m_jpol->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                    (this->_m_jpol,(ulong)johI);
  pDVar1 = this->_m_pu->_m_DecPOMDP;
  dVar7 = (double)(**(code **)(*(long *)pDVar1 + 0xc0))(pDVar1,sI,iVar3);
  IVar4 = PlanningUnitMADPDiscrete::GetTimeStepForJOHI
                    (&this->_m_pu->super_PlanningUnitMADPDiscrete,johI);
  if ((ulong)IVar4 < this->_m_h - 1) {
    if (this->_m_nrS == 0) {
      local_58 = 0.0;
    }
    else {
      uVar5 = 0;
      local_58 = 0.0;
      do {
        pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
        dVar8 = (double)(**(code **)((long)*pMVar2 + 0x108))(pMVar2,sI,iVar3,uVar5);
        if (this->_m_nrJO != 0) {
          uVar6 = 0;
          do {
            pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
            dVar9 = (double)(**(code **)((long)*pMVar2 + 0x118))(pMVar2,iVar3,uVar5,uVar6);
            IVar4 = PlanningUnitMADPDiscrete::GetSuccessorJOHI
                              (&this->_m_pu->super_PlanningUnitMADPDiscrete,johI,(Index)uVar6);
            auVar10._0_8_ = CalculateVsjohRecursively<false>(this,(Index)uVar5,IVar4,stage + 1);
            auVar10._8_56_ = extraout_var;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_58;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = dVar8 * dVar9;
            auVar11 = vfmadd231sd_fma(auVar12,auVar10._0_16_,auVar11);
            local_58 = auVar11._0_8_;
            uVar6 = (ulong)((Index)uVar6 + 1);
          } while (uVar6 < this->_m_nrJO);
        }
        uVar5 = (ulong)((Index)uVar5 + 1);
      } while (uVar5 < this->_m_nrS);
    }
    dVar7 = dVar7 + local_58;
  }
  return dVar7;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively(Index sI,Index johI, Index stage)
{
#if DEBUG_CALCV
    std::cout<< "\nValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
             << sI << ", " << johI << ") called"<<std::endl;
#endif

    Index jaI = GetJPol()->GetJointActionIndex(johI);
    double R = _m_pu->GetReward(sI, jaI);
    double ExpFutureR = 0.0;
    // horizon h policy makes decision on observation histories which 
    // maximally have length h-1. 
    // t=0 - () - length=0 
    // ... 
    // t=h-1 - (o1,...,o{h-1}) - length h-1
    if( ( CACHED && stage >= _m_h - 1) ||
        (!CACHED && _m_pu->GetTimeStepForJOHI(johI) >= _m_h - 1 ) )
    {
#if DEBUG_CALCV
        std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjoh"
                  << "Recursively("<< sI <<", " << johI << ") - V="<<R<<std::endl;
#endif
        return(R);
    }

#if DEBUG_CALCV
    std::cout << "Calculating future reward"<<std::endl;
#endif
    for(Index sucSI = 0; sucSI < _m_nrS; sucSI++)
    {
        double probSucSI = _m_pu->GetTransitionProbability(sI, jaI,sucSI);
#if DEBUG_CALCV
        std::cout << "P(s"<<sucSI<<"|s"<<sI<<",ja"<<jaI<<")="<<probSucSI<<std::endl;
#endif

        for(Index joI = 0; joI < _m_nrJO; joI++)
        {
            double probJOI =  _m_pu->GetObservationProbability(jaI, sucSI, joI);
#if DEBUG_CALCV
            std::cout << "P(jo"<<joI<<"|ja"<<jaI<<",s"<<sucSI<<")="<<probJOI<<std::endl;
#endif
            Index sucJohI = _m_pu->GetSuccessorJOHI(johI, joI);

            double thisSucV;
            bool valid=false;
            if (CACHED)
                thisSucV=GetCached(sucSI,sucJohI,valid); // read from cache
            if (!valid) // if not found in cache or cache is not used
                thisSucV=CalculateVsjohRecursively<CACHED>(sucSI,sucJohI,stage+1);
            ExpFutureR += probSucSI * probJOI * thisSucV;
        }//end for each observation
    }//end for each potential succesor state
    double val = R + ExpFutureR;
    if (CACHED)
        SetCached(sI, johI, val); // write to cache
#if DEBUG_CALCV
    std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
              << sI <<", " << johI << ") \n->immediate R="<<R
              << " \n->exp. future reward="<<ExpFutureR<<"\n->V="<<val<<std::endl;
#endif
    return(val);
}